

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O1

CBlock * blockencodings_tests::BuildBlockTestCase
                   (CBlock *__return_storage_ptr__,FastRandomContext *ctx)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this;
  uint32_t *puVar1;
  uchar *puVar2;
  uint nBits;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  uint256 hash;
  base_blob<256U> *pbVar5;
  undefined1 auVar6 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  CChainParams *params;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<std::byte> output_01;
  CMutableTransaction tx;
  bool mutated;
  uint256 ret;
  CMutableTransaction local_b8;
  bool local_79;
  uint256 local_78;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  uchar local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = &__return_storage_ptr__->vtx;
  __return_storage_ptr__->m_checked_witness_commitment = false;
  __return_storage_ptr__->m_checked_merkle_root = false;
  (__return_storage_ptr__->super_CBlockHeader).nVersion = 0;
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [0] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [1] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [2] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [3] = '\0';
  pbVar5 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[4] = '\0';
  (pbVar5->m_data)._M_elems[5] = '\0';
  (pbVar5->m_data)._M_elems[6] = '\0';
  (pbVar5->m_data)._M_elems[7] = '\0';
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  pbVar5 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  (pbVar5->m_data)._M_elems[0x10] = '\0';
  (pbVar5->m_data)._M_elems[0x11] = '\0';
  (pbVar5->m_data)._M_elems[0x12] = '\0';
  (pbVar5->m_data)._M_elems[0x13] = '\0';
  pbVar5 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x14] = '\0';
  (pbVar5->m_data)._M_elems[0x15] = '\0';
  (pbVar5->m_data)._M_elems[0x16] = '\0';
  (pbVar5->m_data)._M_elems[0x17] = '\0';
  (pbVar5->m_data)._M_elems[0x18] = '\0';
  (pbVar5->m_data)._M_elems[0x19] = '\0';
  (pbVar5->m_data)._M_elems[0x1a] = '\0';
  (pbVar5->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
   + 0x1c) = 0;
  pbVar5 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[4] = '\0';
  (pbVar5->m_data)._M_elems[5] = '\0';
  (pbVar5->m_data)._M_elems[6] = '\0';
  (pbVar5->m_data)._M_elems[7] = '\0';
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  pbVar5 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  (pbVar5->m_data)._M_elems[0x10] = '\0';
  (pbVar5->m_data)._M_elems[0x11] = '\0';
  (pbVar5->m_data)._M_elems[0x12] = '\0';
  (pbVar5->m_data)._M_elems[0x13] = '\0';
  pbVar5 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x14] = '\0';
  (pbVar5->m_data)._M_elems[0x15] = '\0';
  (pbVar5->m_data)._M_elems[0x16] = '\0';
  (pbVar5->m_data)._M_elems[0x17] = '\0';
  (pbVar5->m_data)._M_elems[0x18] = '\0';
  (pbVar5->m_data)._M_elems[0x19] = '\0';
  (pbVar5->m_data)._M_elems[0x1a] = '\0';
  (pbVar5->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x1c) = 0;
  (__return_storage_ptr__->super_CBlockHeader).nBits = 0;
  (__return_storage_ptr__->super_CBlockHeader).nNonce = 0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(this);
  __return_storage_ptr__->fChecked = false;
  __return_storage_ptr__->m_checked_witness_commitment = false;
  __return_storage_ptr__->m_checked_merkle_root = false;
  BuildTransactionTestCase();
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(this,3);
  local_58 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&_Stack_50,(CTransaction **)local_58,(allocator<CTransaction> *)&local_79,&local_b8);
  _Var7._M_pi = _Stack_50._M_pi;
  auVar6 = local_58;
  psVar3 = (this->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (undefined1  [8])0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)auVar6;
  (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var7._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  (__return_storage_ptr__->super_CBlockHeader).nVersion = 0x2a;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_58 = (undefined1  [8])0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  output.m_size = 0x20;
  output.m_data = local_58;
  FastRandomContext::fillrand(ctx,output);
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
   + 0x10) = local_48._0_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
   + 0x18) = local_48._8_8_;
  *(undefined1 (*) [8])
   (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
       = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
   + 8) = _Stack_50._M_pi;
  (__return_storage_ptr__->super_CBlockHeader).nBits = 0x207fffff;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_58 = (undefined1  [8])0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  output_00.m_size = 0x20;
  output_00.m_data = local_58;
  FastRandomContext::fillrand(ctx,output_00);
  *(undefined8 *)
   (((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_48._0_8_;
  *(undefined8 *)
   (((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_48._8_8_;
  *(undefined1 (*) [8])
   ((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   (((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       _Stack_50._M_pi;
  ((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_58 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&_Stack_50,(CTransaction **)local_58,(allocator<CTransaction> *)&local_79,&local_b8);
  _Var7._M_pi = _Stack_50._M_pi;
  auVar6 = local_58;
  psVar3 = (this->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (undefined1  [8])0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar6;
  psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_b8.vin,10);
  if (local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_58 = (undefined1  [8])0x0;
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      output_01.m_size = 0x20;
      output_01.m_data = local_58;
      FastRandomContext::fillrand(ctx,output_01);
      puVar2 = ((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar10 + 0x10;
      *(undefined8 *)puVar2 = local_48._0_8_;
      *(undefined8 *)(puVar2 + 8) = local_48._8_8_;
      puVar2 = ((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar10;
      *(undefined1 (*) [8])puVar2 = local_58;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar2 + 8) = _Stack_50._M_pi;
      *(undefined4 *)
       ((long)(&((local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->prevout).hash + 1) + lVar10) = 0;
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x68;
    } while (uVar9 < (ulong)(((long)local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  local_58 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&_Stack_50,(CTransaction **)local_58,(allocator<CTransaction> *)&local_79,&local_b8);
  _Var7._M_pi = _Stack_50._M_pi;
  auVar6 = local_58;
  psVar3 = (this->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (undefined1  [8])0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = psVar3[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  psVar3[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar6;
  psVar3[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  BlockMerkleRoot((uint256 *)local_58,__return_storage_ptr__,&local_79);
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_48._0_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = local_48._8_8_;
  *(undefined1 (*) [8])
   (__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
       = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 8) = _Stack_50._M_pi;
  if (local_79 == false) {
    while( true ) {
      CBlockHeader::GetHash(&local_78,&__return_storage_ptr__->super_CBlockHeader);
      nBits = (__return_storage_ptr__->super_CBlockHeader).nBits;
      params = Params();
      hash.super_base_blob<256U>.m_data._M_elems[8] =
           local_78.super_base_blob<256U>.m_data._M_elems[8];
      hash.super_base_blob<256U>.m_data._M_elems[9] =
           local_78.super_base_blob<256U>.m_data._M_elems[9];
      hash.super_base_blob<256U>.m_data._M_elems[10] =
           local_78.super_base_blob<256U>.m_data._M_elems[10];
      hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_78.super_base_blob<256U>.m_data._M_elems[0xb];
      hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_78.super_base_blob<256U>.m_data._M_elems[0xc];
      hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_78.super_base_blob<256U>.m_data._M_elems[0xd];
      hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_78.super_base_blob<256U>.m_data._M_elems[0xe];
      hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_78.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems[0] =
           local_78.super_base_blob<256U>.m_data._M_elems[0];
      hash.super_base_blob<256U>.m_data._M_elems[1] =
           local_78.super_base_blob<256U>.m_data._M_elems[1];
      hash.super_base_blob<256U>.m_data._M_elems[2] =
           local_78.super_base_blob<256U>.m_data._M_elems[2];
      hash.super_base_blob<256U>.m_data._M_elems[3] =
           local_78.super_base_blob<256U>.m_data._M_elems[3];
      hash.super_base_blob<256U>.m_data._M_elems[4] =
           local_78.super_base_blob<256U>.m_data._M_elems[4];
      hash.super_base_blob<256U>.m_data._M_elems[5] =
           local_78.super_base_blob<256U>.m_data._M_elems[5];
      hash.super_base_blob<256U>.m_data._M_elems[6] =
           local_78.super_base_blob<256U>.m_data._M_elems[6];
      hash.super_base_blob<256U>.m_data._M_elems[7] =
           local_78.super_base_blob<256U>.m_data._M_elems[7];
      hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x10];
      hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x11];
      hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x12];
      hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x13];
      hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x14];
      hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x15];
      hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x16];
      hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x17];
      hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x18];
      hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x19];
      hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_78.super_base_blob<256U>.m_data._M_elems[0x1f];
      bVar8 = CheckProofOfWork(hash,nBits,&params->consensus);
      if (bVar8) break;
      puVar1 = &(__return_storage_ptr__->super_CBlockHeader).nNonce;
      *puVar1 = *puVar1 + 1;
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b8.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b8.vin);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
  __assert_fail("!mutated",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                ,0x35,"CBlock blockencodings_tests::BuildBlockTestCase(FastRandomContext &)");
}

Assistant:

static CBlock BuildBlockTestCase(FastRandomContext& ctx) {
    CBlock block;
    CMutableTransaction tx = BuildTransactionTestCase();

    block.vtx.resize(3);
    block.vtx[0] = MakeTransactionRef(tx);
    block.nVersion = 42;
    block.hashPrevBlock = ctx.rand256();
    block.nBits = 0x207fffff;

    tx.vin[0].prevout.hash = Txid::FromUint256(ctx.rand256());
    tx.vin[0].prevout.n = 0;
    block.vtx[1] = MakeTransactionRef(tx);

    tx.vin.resize(10);
    for (size_t i = 0; i < tx.vin.size(); i++) {
        tx.vin[i].prevout.hash = Txid::FromUint256(ctx.rand256());
        tx.vin[i].prevout.n = 0;
    }
    block.vtx[2] = MakeTransactionRef(tx);

    bool mutated;
    block.hashMerkleRoot = BlockMerkleRoot(block, &mutated);
    assert(!mutated);
    while (!CheckProofOfWork(block.GetHash(), block.nBits, Params().GetConsensus())) ++block.nNonce;
    return block;
}